

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall
RPCHelpMan::RPCHelpMan
          (RPCHelpMan *this,string name,string description,
          vector<RPCArg,_std::allocator<RPCArg>_> args,RPCResults results,RPCExamples examples,
          RPCMethodImpl *fun)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Manager_type *pp_Var2;
  size_type *psVar3;
  Type TVar4;
  pointer pcVar5;
  pointer pRVar6;
  pointer pRVar7;
  _Invoker_type p_Var8;
  undefined8 uVar9;
  long lVar10;
  string_view func;
  pointer pbVar11;
  util uVar12;
  byte *pbVar13;
  uint *puVar14;
  variant_alternative_t<2UL,_variant<Optional,_basic_string<char,_char_traits<char>,_allocator<char>_>,_UniValue>_>
  *pvVar15;
  NonFatalCheckError *this_00;
  undefined8 *in_RCX;
  long *in_RDX;
  char *in_R8;
  long *in_R9;
  pointer pRVar16;
  pointer pRVar17;
  string *name_1;
  key_type *pkVar18;
  long in_FS_OFFSET;
  bool bVar19;
  string_view msg;
  string_view separators;
  string_view separators_00;
  string_view file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  param_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  pointer local_80;
  size_type sStack_78;
  undefined1 local_69;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = *(pointer *)&(fun->super__Function_base)._M_functor;
  pp_Var2 = &(fun->super__Function_base)._M_manager;
  if ((_Manager_type *)pcVar5 == pp_Var2) {
    p_Var8 = fun->_M_invoker;
    paVar1->_M_allocated_capacity = (size_type)*pp_Var2;
    *(_Invoker_type *)((long)&(this->m_name).field_2 + 8) = p_Var8;
  }
  else {
    (this->m_name)._M_dataplus._M_p = pcVar5;
    (this->m_name).field_2._M_allocated_capacity = (size_type)*pp_Var2;
  }
  (this->m_name)._M_string_length =
       *(size_type *)((long)&(fun->super__Function_base)._M_functor + 8);
  *(_Manager_type **)&(fun->super__Function_base)._M_functor = pp_Var2;
  *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8) = 0;
  *(undefined1 *)&(fun->super__Function_base)._M_manager = 0;
  (this->m_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->m_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fun).super__Function_base._M_functor + 8) = 0;
  (this->m_fun)._M_invoker = *(_Invoker_type *)(name._M_dataplus._M_p + 0x18);
  if (*(long *)(name._M_dataplus._M_p + 0x10) != 0) {
    uVar9 = *(undefined8 *)(name._M_dataplus._M_p + 8);
    *(undefined8 *)&(this->m_fun).super__Function_base._M_functor =
         *(undefined8 *)name._M_dataplus._M_p;
    *(undefined8 *)((long)&(this->m_fun).super__Function_base._M_functor + 8) = uVar9;
    (this->m_fun).super__Function_base._M_manager = *(_Manager_type *)(name._M_dataplus._M_p + 0x10)
    ;
    name._M_dataplus._M_p[0x10] = '\0';
    name._M_dataplus._M_p[0x11] = '\0';
    name._M_dataplus._M_p[0x12] = '\0';
    name._M_dataplus._M_p[0x13] = '\0';
    name._M_dataplus._M_p[0x14] = '\0';
    name._M_dataplus._M_p[0x15] = '\0';
    name._M_dataplus._M_p[0x16] = '\0';
    name._M_dataplus._M_p[0x17] = '\0';
    name._M_dataplus._M_p[0x18] = '\0';
    name._M_dataplus._M_p[0x19] = '\0';
    name._M_dataplus._M_p[0x1a] = '\0';
    name._M_dataplus._M_p[0x1b] = '\0';
    name._M_dataplus._M_p[0x1c] = '\0';
    name._M_dataplus._M_p[0x1d] = '\0';
    name._M_dataplus._M_p[0x1e] = '\0';
    name._M_dataplus._M_p[0x1f] = '\0';
  }
  paVar1 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)paVar1;
  psVar3 = (size_type *)(in_RDX + 2);
  if ((size_type *)*in_RDX == psVar3) {
    lVar10 = in_RDX[3];
    paVar1->_M_allocated_capacity = *psVar3;
    *(long *)((long)&(this->m_description).field_2 + 8) = lVar10;
  }
  else {
    (this->m_description)._M_dataplus._M_p = (pointer)*in_RDX;
    (this->m_description).field_2._M_allocated_capacity = *psVar3;
  }
  (this->m_description)._M_string_length = in_RDX[1];
  *in_RDX = (long)psVar3;
  in_RDX[1] = 0;
  *(undefined1 *)(in_RDX + 2) = 0;
  pRVar16 = (pointer)in_RCX[1];
  (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)*in_RCX;
  (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar16;
  (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_RCX[2];
  in_RCX[2] = 0;
  *in_RCX = 0;
  in_RCX[1] = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&(this->m_results).m_results,(vector<RPCResult,_std::allocator<RPCResult>_> *)in_R8);
  (this->m_examples).m_examples._M_dataplus._M_p = (pointer)&(this->m_examples).m_examples.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this->m_examples,*in_R9,in_R9[1] + *in_R9);
  this->m_req = (JSONRPCRequest *)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  pRVar6 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pRVar16 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                 super__Vector_impl_data._M_start; pRVar16 != pRVar6; pRVar16 = pRVar16 + 1) {
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(pRVar16->m_names)._M_dataplus._M_p;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pRVar16->m_names)._M_string_length;
    local_80._1_7_ = (undefined7)((ulong)local_80 >> 8);
    local_80 = (pointer)CONCAT71(local_80._1_7_,0x7c);
    separators._M_str = in_R8;
    separators._M_len = (size_t)&local_80;
    util::Split<std::__cxx11::string>
              (&local_98,(util *)&local_b0,(Span<const_char> *)0x1,separators);
    pbVar11 = local_98.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pkVar18 = local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pkVar18 != pbVar11;
        pkVar18 = pkVar18 + 1) {
      pbVar13 = (byte *)std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                      *)&local_68,pkVar18);
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(CONCAT71(local_b0.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,~*pbVar13) &
                    0xffffffffffffff01);
      inline_check_non_fatal<bool>
                ((bool *)&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                 ,0x23d,"RPCHelpMan","!(param_type & POSITIONAL)");
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_b0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,(*pbVar13 & 4) == 0);
      in_R8 = "!(param_type & NAMED_ONLY)";
      inline_check_non_fatal<bool>
                ((bool *)&local_b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                 ,0x23e,"RPCHelpMan","!(param_type & NAMED_ONLY)");
      *pbVar13 = *pbVar13 | 1;
    }
    if (pRVar16->m_type == OBJ_NAMED_PARAMS) {
      pRVar7 = (pRVar16->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pRVar17 = (pRVar16->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                     super__Vector_impl_data._M_start; pRVar17 != pRVar7; pRVar17 = pRVar17 + 1) {
        local_80 = (pRVar17->m_names)._M_dataplus._M_p;
        sStack_78 = (pRVar17->m_names)._M_string_length;
        local_69 = 0x7c;
        separators_00._M_str = in_R8;
        separators_00._M_len = (size_t)&local_69;
        util::Split<std::__cxx11::string>
                  (&local_b0,(util *)&local_80,(Span<const_char> *)0x1,separators_00);
        pbVar11 = local_b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pkVar18 = local_b0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pkVar18 != pbVar11;
            pkVar18 = pkVar18 + 1) {
          puVar14 = (uint *)std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                          *)&local_68,pkVar18);
          uVar12 = (util)(pRVar17->m_opts).also_positional;
          if ((*puVar14 & 1) == 0) {
            uVar12 = (util)0x1;
          }
          local_80._0_1_ = uVar12;
          inline_check_non_fatal<bool>
                    ((bool *)&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                     ,0x246,"RPCHelpMan",
                     "!(param_type & POSITIONAL) || inner.m_opts.also_positional");
          local_80._0_1_ = (util)((*puVar14 & 2) == 0);
          inline_check_non_fatal<bool>
                    ((bool *)&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                     ,0x247,"RPCHelpMan","!(param_type & NAMED)");
          local_80 = (pointer)CONCAT71(local_80._1_7_,(*puVar14 & 4) == 0);
          in_R8 = "!(param_type & NAMED_ONLY)";
          inline_check_non_fatal<bool>
                    ((bool *)&local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                     ,0x248,"RPCHelpMan","!(param_type & NAMED_ONLY)");
          *puVar14 = *puVar14 | ((pRVar17->m_opts).also_positional ^ 1) * 2 + 2;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b0);
      }
    }
    if (*(__index_type *)
         ((long)&(pRVar16->m_fallback).
                 super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                 .
                 super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
         + 0x58) == '\x02') {
      TVar4 = pRVar16->m_type;
      pvVar15 = std::get<2ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&pRVar16->m_fallback);
      switch(pvVar15->typ) {
      case VNULL:
        break;
      case VOBJ:
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,TVar4 == OBJ);
        in_R8 = "type == RPCArg::Type::OBJ";
        inline_check_non_fatal<bool>
                  ((bool *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x252,"RPCHelpMan","type == RPCArg::Type::OBJ");
        break;
      case VARR:
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,TVar4 == ARR);
        in_R8 = "type == RPCArg::Type::ARR";
        inline_check_non_fatal<bool>
                  ((bool *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x255,"RPCHelpMan","type == RPCArg::Type::ARR");
        break;
      case VSTR:
        bVar19 = true;
        if ((TVar4 != STR) && (TVar4 != STR_HEX)) {
          bVar19 = TVar4 == AMOUNT;
        }
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar19);
        in_R8 = 
        "type == RPCArg::Type::STR || type == RPCArg::Type::STR_HEX || type == RPCArg::Type::AMOUNT"
        ;
        inline_check_non_fatal<bool>
                  ((bool *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,600,"RPCHelpMan",
                   "type == RPCArg::Type::STR || type == RPCArg::Type::STR_HEX || type == RPCArg::Type::AMOUNT"
                  );
        break;
      case VNUM:
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               TVar4 == RANGE || (TVar4 & ~BOOL) == NUM);
        in_R8 = 
        "type == RPCArg::Type::NUM || type == RPCArg::Type::AMOUNT || type == RPCArg::Type::RANGE";
        inline_check_non_fatal<bool>
                  ((bool *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x25b,"RPCHelpMan",
                   "type == RPCArg::Type::NUM || type == RPCArg::Type::AMOUNT || type == RPCArg::Type::RANGE"
                  );
        break;
      case VBOOL:
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_b0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,TVar4 == BOOL);
        in_R8 = "type == RPCArg::Type::BOOL";
        inline_check_non_fatal<bool>
                  ((bool *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                   ,0x25e,"RPCHelpMan","type == RPCArg::Type::BOOL");
        break;
      default:
        this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
        func._M_str = "RPCHelpMan";
        func._M_len = 10;
        msg._M_str = "Unreachable code reached (non-fatal)";
        msg._M_len = 0x24;
        file._M_str = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
        file._M_len = 0x55;
        NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x264,func);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_006f6e44;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_006f6e44:
  __stack_chk_fail();
}

Assistant:

RPCHelpMan::RPCHelpMan(std::string name, std::string description, std::vector<RPCArg> args, RPCResults results, RPCExamples examples, RPCMethodImpl fun)
    : m_name{std::move(name)},
      m_fun{std::move(fun)},
      m_description{std::move(description)},
      m_args{std::move(args)},
      m_results{std::move(results)},
      m_examples{std::move(examples)}
{
    // Map of parameter names and types just used to check whether the names are
    // unique. Parameter names always need to be unique, with the exception that
    // there can be pairs of POSITIONAL and NAMED parameters with the same name.
    enum ParamType { POSITIONAL = 1, NAMED = 2, NAMED_ONLY = 4 };
    std::map<std::string, int> param_names;

    for (const auto& arg : m_args) {
        std::vector<std::string> names = SplitString(arg.m_names, '|');
        // Should have unique named arguments
        for (const std::string& name : names) {
            auto& param_type = param_names[name];
            CHECK_NONFATAL(!(param_type & POSITIONAL));
            CHECK_NONFATAL(!(param_type & NAMED_ONLY));
            param_type |= POSITIONAL;
        }
        if (arg.m_type == RPCArg::Type::OBJ_NAMED_PARAMS) {
            for (const auto& inner : arg.m_inner) {
                std::vector<std::string> inner_names = SplitString(inner.m_names, '|');
                for (const std::string& inner_name : inner_names) {
                    auto& param_type = param_names[inner_name];
                    CHECK_NONFATAL(!(param_type & POSITIONAL) || inner.m_opts.also_positional);
                    CHECK_NONFATAL(!(param_type & NAMED));
                    CHECK_NONFATAL(!(param_type & NAMED_ONLY));
                    param_type |= inner.m_opts.also_positional ? NAMED : NAMED_ONLY;
                }
            }
        }
        // Default value type should match argument type only when defined
        if (arg.m_fallback.index() == 2) {
            const RPCArg::Type type = arg.m_type;
            switch (std::get<RPCArg::Default>(arg.m_fallback).getType()) {
            case UniValue::VOBJ:
                CHECK_NONFATAL(type == RPCArg::Type::OBJ);
                break;
            case UniValue::VARR:
                CHECK_NONFATAL(type == RPCArg::Type::ARR);
                break;
            case UniValue::VSTR:
                CHECK_NONFATAL(type == RPCArg::Type::STR || type == RPCArg::Type::STR_HEX || type == RPCArg::Type::AMOUNT);
                break;
            case UniValue::VNUM:
                CHECK_NONFATAL(type == RPCArg::Type::NUM || type == RPCArg::Type::AMOUNT || type == RPCArg::Type::RANGE);
                break;
            case UniValue::VBOOL:
                CHECK_NONFATAL(type == RPCArg::Type::BOOL);
                break;
            case UniValue::VNULL:
                // Null values are accepted in all arguments
                break;
            default:
                NONFATAL_UNREACHABLE();
                break;
            }
        }
    }
}